

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O2

void helper_per_ifetch(CPUS390XState_conflict *env,uint64_t addr)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  uint32_t uVar4;
  CPUS390XState_conflict *__mptr;
  uint uVar5;
  
  uVar5 = (uint)env->cregs[9];
  if ((uVar5 >> 0x1e & 1) != 0) {
    uVar1 = env->cregs[10];
    uVar2 = env->cregs[0xb];
    if (uVar2 < uVar1) {
      if (addr < uVar1 && uVar2 < addr) {
        return;
      }
    }
    else if (addr < uVar1 || uVar2 < addr) {
      return;
    }
    env->per_address = addr;
    bVar3 = get_per_atmid(env);
    env->per_perc_atmid = bVar3 + 0x4000;
    if ((uVar5 >> 0x18 & 1) != 0) {
      env->per_perc_atmid = bVar3 | 0x4100;
      env->int_pgm_code = 0x80;
      uVar4 = cpu_ldub_code_s390x(env,addr);
      uVar4 = get_ilen((uint8_t)uVar4);
      env->int_pgm_ilen = uVar4;
      *(undefined4 *)(env[-3].gscb + 2) = 3;
      cpu_loop_exit_s390x((CPUState *)(env[-0x1e].vregs + 0xf));
    }
  }
  return;
}

Assistant:

void HELPER(per_ifetch)(CPUS390XState *env, uint64_t addr)
{
    if ((env->cregs[9] & PER_CR9_EVENT_IFETCH) && get_per_in_range(env, addr)) {
        env->per_address = addr;
        env->per_perc_atmid = PER_CODE_EVENT_IFETCH | get_per_atmid(env);

        /* If the instruction has to be nullified, trigger the
           exception immediately. */
        if (env->cregs[9] & PER_CR9_EVENT_NULLIFICATION) {
            CPUState *cs = env_cpu(env);

            env->per_perc_atmid |= PER_CODE_EVENT_NULLIFICATION;
            env->int_pgm_code = PGM_PER;
            env->int_pgm_ilen = get_ilen(cpu_ldub_code(env, addr));

            cs->exception_index = EXCP_PGM;
            cpu_loop_exit(cs);
        }
    }
}